

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O1

int Abc_NtkRetimeMinDelay
              (Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkCopy,int nDelayLim,int nIterLimit,int fForward,
              int fVerbose)

{
  int iVar1;
  int iVar2;
  int IterBest2;
  int IterBest;
  int local_38;
  int local_34;
  
  iVar1 = Abc_NtkRetimeMinDelayTry(pNtkCopy,nDelayLim,fForward,0,nIterLimit,&local_34,fVerbose);
  if (local_34 != 0) {
    iVar2 = Abc_NtkRetimeMinDelayTry(pNtk,nDelayLim,fForward,1,local_34,&local_38,fVerbose);
    if (iVar1 != iVar2) {
      __assert_fail("DelayBest == DelayBest2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retDelay.c"
                    ,0x3c,"int Abc_NtkRetimeMinDelay(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)")
      ;
    }
    if (local_34 != local_38) {
      __assert_fail("IterBest == IterBest2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retDelay.c"
                    ,0x3d,"int Abc_NtkRetimeMinDelay(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)")
      ;
    }
  }
  return 1;
}

Assistant:

int Abc_NtkRetimeMinDelay( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkCopy, int nDelayLim, int nIterLimit, int fForward, int fVerbose )
{
    int IterBest, DelayBest;
    int IterBest2, DelayBest2;
    // try to find the best delay iteration on a copy
    DelayBest = Abc_NtkRetimeMinDelayTry( pNtkCopy, nDelayLim, fForward, 0, nIterLimit, &IterBest, fVerbose );
    if ( IterBest == 0 )
        return 1;
    // perform the given number of iterations on the original network
    DelayBest2 = Abc_NtkRetimeMinDelayTry( pNtk, nDelayLim, fForward, 1, IterBest, &IterBest2, fVerbose );
    assert( DelayBest == DelayBest2 );
    assert( IterBest == IterBest2 );
    return 1;
}